

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cio.c
# Opt level: O1

OPJ_BOOL opj_stream_read_seek
                   (opj_stream_private_t *p_stream,OPJ_OFF_T p_size,opj_event_mgr_t *p_event_mgr)

{
  OPJ_BOOL OVar1;
  
  p_stream->m_current_data = p_stream->m_stored_data;
  p_stream->m_bytes_in_buffer = 0;
  OVar1 = (*p_stream->m_seek_fn)(p_size,p_stream->m_user_data);
  if (OVar1 == 0) {
    p_stream->m_status = p_stream->m_status | 4;
  }
  else {
    p_stream->m_status = p_stream->m_status & 0xfffffffb;
    p_stream->m_byte_offset = p_size;
  }
  return (uint)(OVar1 != 0);
}

Assistant:

OPJ_BOOL opj_stream_read_seek(opj_stream_private_t * p_stream, OPJ_OFF_T p_size,
                              opj_event_mgr_t * p_event_mgr)
{
    OPJ_ARG_NOT_USED(p_event_mgr);
    p_stream->m_current_data = p_stream->m_stored_data;
    p_stream->m_bytes_in_buffer = 0;

    if (!(p_stream->m_seek_fn(p_size, p_stream->m_user_data))) {
        p_stream->m_status |= OPJ_STREAM_STATUS_END;
        return OPJ_FALSE;
    } else {
        /* reset stream status */
        p_stream->m_status &= (~OPJ_STREAM_STATUS_END);
        p_stream->m_byte_offset = p_size;

    }

    return OPJ_TRUE;
}